

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

SockAddr * unix_sock_addr(char *path)

{
  uint uVar1;
  SockAddr *__s;
  char *pcVar2;
  
  __s = (SockAddr *)safemalloc(1,0x220,0);
  memset(__s,0,0x220);
  __s->superfamily = UNIX;
  uVar1 = snprintf(__s->hostname,0x200,"%s",path);
  if ((int)uVar1 < 0) {
    pcVar2 = "snprintf failed";
  }
  else {
    if (uVar1 < 0x6c) goto LAB_0011bf5f;
    pcVar2 = "socket pathname too long";
  }
  __s->error = pcVar2;
LAB_0011bf5f:
  __s->ais = (addrinfo *)0x0;
  __s->refcount = 1;
  return __s;
}

Assistant:

SockAddr *unix_sock_addr(const char *path)
{
    SockAddr *ret = snew(SockAddr);
    int n;

    memset(ret, 0, sizeof *ret);
    ret->superfamily = UNIX;
    n = snprintf(ret->hostname, sizeof ret->hostname, "%s", path);

    if (n < 0)
        ret->error = "snprintf failed";
    else if (n >= sizeof ret->hostname ||
             n >= sizeof(((struct sockaddr_un *)0)->sun_path))
        ret->error = "socket pathname too long";

#ifndef NO_IPV6
    ret->ais = NULL;
#else
    ret->addresses = NULL;
    ret->naddresses = 0;
#endif
    ret->refcount = 1;
    return ret;
}